

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  _xmlAttr *p_Var1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  xmlNsPtr pxVar5;
  ulong uVar6;
  _xmlNode *p_Var7;
  long lVar8;
  int iVar9;
  uint uVar10;
  xmlNodePtr pxVar11;
  _xmlAttr **pp_Var12;
  
  iVar9 = -1;
  if ((((tree != (xmlNodePtr)0x0) && (doc != (xmlDocPtr)0x0)) && (tree->type == XML_ELEMENT_NODE))
     && ((doc->type == XML_DOCUMENT_NODE && (tree->doc == doc)))) {
    pvVar2 = (void *)0x0;
    pvVar3 = (void *)0x0;
    iVar9 = 0;
    uVar10 = 0;
    pxVar11 = tree;
    while (p_Var7 = pxVar11, p_Var7 != (xmlNodePtr)0x0) {
      if (p_Var7->ns != (xmlNs *)0x0) {
        if (iVar9 == 0) {
          pvVar2 = (*xmlMalloc)(0x50);
          if (pvVar2 == (void *)0x0) {
LAB_00182bdf:
            xmlTreeErrMemory("fixing namespaces");
            return -1;
          }
          pvVar3 = (*xmlMalloc)(0x50);
          if (pvVar3 != (void *)0x0) {
            iVar9 = 10;
            goto LAB_001828e1;
          }
LAB_00182bc7:
          pvVar3 = pvVar2;
          xmlTreeErrMemory("fixing namespaces");
LAB_00182c2c:
          (*xmlFree)(pvVar3);
          return -1;
        }
LAB_001828e1:
        uVar4 = 0;
        if (0 < (int)uVar10) {
          uVar4 = (ulong)uVar10;
        }
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          if (*(xmlNs **)((long)pvVar2 + uVar6 * 8) == p_Var7->ns) {
            p_Var7->ns = *(xmlNs **)((long)pvVar3 + uVar6 * 8);
            uVar4 = uVar6 & 0xffffffff;
            break;
          }
        }
        if (((uint)uVar4 == uVar10) &&
           (pxVar5 = xmlNewReconciledNs(doc,tree,p_Var7->ns), pxVar5 != (xmlNsPtr)0x0)) {
          if (iVar9 <= (int)uVar10) {
            iVar9 = iVar9 * 2;
            pvVar2 = (*xmlRealloc)(pvVar2,(long)iVar9 << 3);
            if (pvVar2 == (void *)0x0) {
              xmlTreeErrMemory("fixing namespaces");
              goto LAB_00182c2c;
            }
            pvVar3 = (*xmlRealloc)(pvVar3,(long)iVar9 << 3);
            if (pvVar3 == (void *)0x0) goto LAB_00182bc7;
          }
          lVar8 = (long)(int)uVar10;
          *(xmlNsPtr *)((long)pvVar3 + lVar8 * 8) = pxVar5;
          uVar10 = uVar10 + 1;
          *(xmlNs **)((long)pvVar2 + lVar8 * 8) = p_Var7->ns;
          p_Var7->ns = pxVar5;
        }
      }
      if (p_Var7->type == XML_ELEMENT_NODE) {
        pp_Var12 = &p_Var7->properties;
        while (p_Var1 = *pp_Var12, p_Var1 != (_xmlAttr *)0x0) {
          if (p_Var1->ns != (xmlNs *)0x0) {
            if (iVar9 == 0) {
              pvVar2 = (*xmlMalloc)(0x50);
              if (pvVar2 == (void *)0x0) goto LAB_00182bdf;
              pvVar3 = (*xmlMalloc)(0x50);
              if (pvVar3 == (void *)0x0) goto LAB_00182bc7;
              iVar9 = 10;
            }
            uVar4 = 0;
            if (0 < (int)uVar10) {
              uVar4 = (ulong)uVar10;
            }
            for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
              if (*(xmlNs **)((long)pvVar2 + uVar6 * 8) == p_Var1->ns) {
                p_Var1->ns = *(xmlNs **)((long)pvVar3 + uVar6 * 8);
                uVar4 = uVar6 & 0xffffffff;
                break;
              }
            }
            if (((uint)uVar4 == uVar10) &&
               (pxVar5 = xmlNewReconciledNs(doc,tree,p_Var1->ns), pxVar5 != (xmlNsPtr)0x0)) {
              if (iVar9 <= (int)uVar10) {
                iVar9 = iVar9 * 2;
                pvVar2 = (*xmlRealloc)(pvVar2,(long)iVar9 << 3);
                if (pvVar2 == (void *)0x0) {
                  xmlTreeErrMemory("fixing namespaces");
                  goto LAB_00182c2c;
                }
                pvVar3 = (*xmlRealloc)(pvVar3,(long)iVar9 << 3);
                if (pvVar3 == (void *)0x0) goto LAB_00182bc7;
              }
              lVar8 = (long)(int)uVar10;
              *(xmlNsPtr *)((long)pvVar3 + lVar8 * 8) = pxVar5;
              uVar10 = uVar10 + 1;
              *(xmlNs **)((long)pvVar2 + lVar8 * 8) = p_Var1->ns;
              p_Var1->ns = pxVar5;
            }
          }
          pp_Var12 = &p_Var1->next;
        }
      }
      if ((p_Var7->children == (_xmlNode *)0x0) ||
         (pxVar11 = p_Var7->children, p_Var7->type == XML_ENTITY_REF_NODE)) {
        if (p_Var7 == tree) break;
        pxVar11 = p_Var7->next;
        if (p_Var7->next == (_xmlNode *)0x0) {
          do {
            if (p_Var7 == tree) goto LAB_00182bb6;
            pxVar11 = p_Var7;
            if (p_Var7->parent != (xmlNodePtr)0x0) {
              pxVar11 = p_Var7->parent;
            }
            if ((pxVar11 != tree) && (p_Var7 = pxVar11->next, p_Var7 != (_xmlNode *)0x0))
            goto LAB_00182bb6;
            p_Var7 = pxVar11;
          } while (pxVar11->parent != (_xmlNode *)0x0);
          p_Var7 = (_xmlNode *)0x0;
LAB_00182bb6:
          pxVar11 = (xmlNodePtr)0x0;
          if (p_Var7 != tree) {
            pxVar11 = p_Var7;
          }
        }
      }
    }
    if (pvVar2 != (void *)0x0) {
      (*xmlFree)(pvVar2);
    }
    iVar9 = 0;
    if (pvVar3 != (void *)0x0) {
      (*xmlFree)(pvVar3);
    }
  }
  return iVar9;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsPtr *oldNs = NULL;
    xmlNsPtr *newNs = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if ((doc == NULL) || (doc->type != XML_DOCUMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    /*
	     * initialize the cache if needed
	     */
	    if (sizeCache == 0) {
		sizeCache = 10;
		oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (oldNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    return(-1);
		}
		newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (newNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    xmlFree(oldNs);
		    return(-1);
		}
	    }
	    for (i = 0;i < nbCache;i++) {
	        if (oldNs[i] == node->ns) {
		    node->ns = newNs[i];
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(doc, tree, node->ns);
		if (n != NULL) { /* :-( what if else ??? */
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if (sizeCache <= nbCache) {
		        sizeCache *= 2;
			oldNs = (xmlNsPtr *) xmlRealloc(oldNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(newNs);
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlRealloc(newNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    newNs[nbCache] = n;
		    oldNs[nbCache++] = node->ns;
		    node->ns = n;
                }
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    /*
		     * initialize the cache if needed
		     */
		    if (sizeCache == 0) {
			sizeCache = 10;
			oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    for (i = 0;i < nbCache;i++) {
			if (oldNs[i] == attr->ns) {
			    attr->ns = newNs[i];
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(doc, tree, attr->ns);
			if (n != NULL) { /* :-( what if else ??? */
			    /*
			     * check if we need to grow the cache buffers.
			     */
			    if (sizeCache <= nbCache) {
				sizeCache *= 2;
				oldNs = (xmlNsPtr *) xmlRealloc(oldNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (oldNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(newNs);
				    return(-1);
				}
				newNs = (xmlNsPtr *) xmlRealloc(newNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (newNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(oldNs);
				    return(-1);
				}
			    }
			    newNs[nbCache] = n;
			    oldNs[nbCache++] = attr->ns;
			    attr->ns = n;
			}
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (oldNs != NULL)
	xmlFree(oldNs);
    if (newNs != NULL)
	xmlFree(newNs);
    return(ret);
}